

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O2

void __thiscall
bitfoot::Bitfoot::AddMove<true,(bitfoot::MoveType)6>
          (Bitfoot *this,int piece,int from,int to,int score,int cap,int promo)

{
  int32_t *piVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  Move *this_00;
  
  lVar4 = (long)this->moveCount;
  if (0x7e < lVar4) {
    __assert_fail("(moveCount + 1) < MaxMoves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa78,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  if (0x3f < (uint)from) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7a,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  if (0x3f < (uint)to) {
    __assert_fail("IS_SQUARE(to)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7b,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  if (0xb < piece - 2U) {
    __assert_fail("IS_PIECE(piece)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7c,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  if ((piece & 1U) == 0) {
    __assert_fail("COLOR_OF(piece) == color",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7d,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  if ((&_board)[(uint)from] != piece) {
    __assert_fail("_board[from] == piece",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7e,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  uVar5 = -score;
  if (0 < score) {
    uVar5 = score;
  }
  if (31999 < uVar5) {
    __assert_fail("abs(score) < Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7f,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  if (9 < cap - 2U && cap != 0) {
    __assert_fail("!cap || ((cap >= Pawn) && (cap < King))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa80,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  if ((cap & 1U) == 0) {
    if ((0xb < (uint)promo) || ((0xff1U >> (promo & 0x1fU) & 1) == 0)) {
      __assert_fail("!promo || ((promo >= Knight) && (promo < King))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0xa82,
                    "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                   );
    }
    if ((promo & 1U) == 0 && promo != 0) {
      __assert_fail("!promo || (COLOR_OF(promo) == color)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0xa83,
                    "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                   );
    }
    this->moveCount = this->moveCount + 1;
    this_00 = this->moves + lVar4;
    Move::Init(this_00,KingMove,from,to,piece,cap,promo,score);
    if ((this->moves[lVar4].bits & 0xff00000) == 0) {
      bVar2 = IsKiller(this,this_00);
      if (bVar2) {
        iVar3 = 0x32;
      }
      else {
        iVar3 = (int)(char)_hist[this_00->bits >> 4 & 0xffff];
        if (iVar3 < -2) {
          __assert_fail("_hist[move.GetHistoryIndex()] >= -2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                        ,0xa90,
                        "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                       );
        }
        if ('(' < (char)_hist[this_00->bits >> 4 & 0xffff]) {
          __assert_fail("_hist[move.GetHistoryIndex()] <= 40",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                        ,0xa91,
                        "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                       );
        }
      }
      piVar1 = &this->moves[lVar4].score;
      *piVar1 = *piVar1 + iVar3;
    }
    return;
  }
  __assert_fail("!cap || (COLOR_OF(cap) != color)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                ,0xa81,
                "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
               );
}

Assistant:

inline void AddMove(const int piece,
                      const int from,
                      const int to,
                      const int score,
                      const int cap,
                      const int promo)
  {
    assert((moveCount + 1) < MaxMoves);
    assert(IS_MOVE_TYPE(type));
    assert(IS_SQUARE(from));
    assert(IS_SQUARE(to));
    assert(IS_PIECE(piece));
    assert(COLOR_OF(piece) == color);
    assert(_board[from] == piece);
    assert(abs(score) < Infinity);
    assert(!cap || ((cap >= Pawn) && (cap < King)));
    assert(!cap || (COLOR_OF(cap) != color));
    assert(!promo || ((promo >= Knight) && (promo < King)));
    assert(!promo || (COLOR_OF(promo) == color));

    Move& move = moves[moveCount++];
    move.Init(type, from, to, piece, cap, promo,
              (score + ((type < KingMove)
                        ? (SquareValue(piece, to) - SquareValue(piece, from))
                        : 0)));

    if (!move.IsCapOrPromo()) {
      if (IsKiller(move)) {
        move.Score() += 50;
      }
      else {
        assert(_hist[move.GetHistoryIndex()] >= -2);
        assert(_hist[move.GetHistoryIndex()] <= 40);
        move.Score() += _hist[move.GetHistoryIndex()];
      }
    }
  }